

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_iterators.h
# Opt level: O2

void __thiscall
st_tree::detail::
b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
::b1st_iterator(b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
                *this,value_type *root)

{
  value_type *local_18;
  
  this->_vptr_b1st_iterator = (_func_int **)&PTR__b1st_iterator_002caad8;
  std::
  _Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::_Deque_base(&(this->_queue).
                 super__Deque_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
               );
  if (root != (value_type *)0x0) {
    local_18 = root;
    std::
    deque<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*,std::allocator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*>>
    ::
    emplace_back<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*>
              ((deque<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*,std::allocator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*>>
                *)&this->_queue,&local_18);
  }
  return;
}

Assistant:

b1st_iterator(value_type* root) {
        if (root == NULL) return;
        _queue.push_back(const_cast<node_type*>(root));
    }